

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_DecCreateCnf(Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,Vec_Wec_t *vGateCnfs)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Str_t *vCnf;
  char *pcVar3;
  Vec_Int_t *vCover;
  int *__ptr;
  void *__ptr_00;
  long lVar4;
  int iVar5;
  long lVar6;
  
  vCnf = (Vec_Str_t *)malloc(0x10);
  vCnf->nCap = 100;
  vCnf->nSize = 0;
  pcVar3 = (char *)malloc(100);
  vCnf->pArray = pcVar3;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 100;
  vCover->nSize = 0;
  __ptr = (int *)malloc(400);
  vCover->pArray = __ptr;
  if (0 < vGateFuncs->nSize) {
    lVar4 = 8;
    lVar6 = 0;
    do {
      if (vGateSizes->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Sfm_TruthToCnf(vGateFuncs->pArray[lVar6],vGateSizes->pArray[lVar6],vCover,vCnf);
      if (vGateCnfs->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar2 = vGateCnfs->pArray;
      iVar1 = vCnf->nSize;
      __ptr_00 = *(void **)((long)&pVVar2->nCap + lVar4);
      iVar5 = iVar1;
      if (*(int *)((long)pVVar2 + lVar4 + -8) < iVar1) {
        if (__ptr_00 == (void *)0x0) {
          __ptr_00 = malloc((long)iVar1);
        }
        else {
          __ptr_00 = realloc(__ptr_00,(long)iVar1);
          iVar5 = vCnf->nSize;
        }
        *(void **)((long)&pVVar2->nCap + lVar4) = __ptr_00;
        *(int *)((long)pVVar2 + lVar4 + -8) = iVar1;
      }
      memcpy(__ptr_00,vCnf->pArray,(long)iVar5);
      *(int *)((long)pVVar2 + lVar4 + -4) = vCnf->nSize;
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar6 < vGateFuncs->nSize);
    __ptr = vCover->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vCover);
  if (vCnf->pArray != (char *)0x0) {
    free(vCnf->pArray);
  }
  free(vCnf);
  return;
}

Assistant:

void Sfm_DecCreateCnf( Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs )
{
    Vec_Str_t * vCnf, * vCnfBase;
    Vec_Int_t * vCover;
    word uTruth;
    int i, nCubes;
    vCnf = Vec_StrAlloc( 100 );
    vCover = Vec_IntAlloc( 100 );
    Vec_WrdForEachEntry( vGateFuncs, uTruth, i )
    {
        nCubes = Sfm_TruthToCnf( uTruth, Vec_IntEntry(vGateSizes, i), vCover, vCnf );
        vCnfBase = (Vec_Str_t *)Vec_WecEntry( vGateCnfs, i );
        Vec_StrGrow( vCnfBase, Vec_StrSize(vCnf) );
        memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(vCnf), Vec_StrSize(vCnf) );
        vCnfBase->nSize = Vec_StrSize(vCnf);
    }
    Vec_IntFree( vCover );
    Vec_StrFree( vCnf );
}